

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O1

mi_page_t * mi_large_huge_page_alloc(mi_heap_t *heap,size_t size,size_t page_alignment)

{
  size_t block_size;
  mi_page_t *pmVar1;
  size_t sVar2;
  
  block_size = _mi_os_good_alloc_size(size);
  sVar2 = block_size;
  if (0x1000000 < block_size) {
    sVar2 = 0x1000001;
  }
  if (page_alignment != 0) {
    sVar2 = 0x1000001;
  }
  sVar2 = _mi_bin(sVar2);
  pmVar1 = mi_page_fresh_alloc(heap,heap->pages + sVar2,block_size,page_alignment);
  if (pmVar1 != (mi_page_t *)0x0) {
    _mi_stat_increase(&(heap->tld->stats).malloc_huge,pmVar1->block_size);
    _mi_stat_counter_increase(&(heap->tld->stats).malloc_huge_count,1);
  }
  return pmVar1;
}

Assistant:

static mi_page_t* mi_large_huge_page_alloc(mi_heap_t* heap, size_t size, size_t page_alignment) {
  size_t block_size = _mi_os_good_alloc_size(size);
  mi_assert_internal(mi_bin(block_size) == MI_BIN_HUGE || page_alignment > 0);
  bool is_huge = (block_size > MI_LARGE_OBJ_SIZE_MAX || page_alignment > 0);
  #if MI_HUGE_PAGE_ABANDON
  mi_page_queue_t* pq = (is_huge ? NULL : mi_page_queue(heap, block_size));
  #else
  mi_page_queue_t* pq = mi_page_queue(heap, is_huge ? MI_LARGE_OBJ_SIZE_MAX+1 : block_size);
  mi_assert_internal(!is_huge || mi_page_queue_is_huge(pq));
  #endif
  mi_page_t* page = mi_page_fresh_alloc(heap, pq, block_size, page_alignment);
  if (page != NULL) {
    mi_assert_internal(mi_page_immediate_available(page));

    if (is_huge) {
      mi_assert_internal(mi_page_is_huge(page));
      mi_assert_internal(_mi_page_segment(page)->kind == MI_SEGMENT_HUGE);
      mi_assert_internal(_mi_page_segment(page)->used==1);
      #if MI_HUGE_PAGE_ABANDON
      mi_assert_internal(_mi_page_segment(page)->thread_id==0); // abandoned, not in the huge queue
      mi_page_set_heap(page, NULL);
      #endif
    }
    else {
      mi_assert_internal(!mi_page_is_huge(page));
    }

    const size_t bsize = mi_page_usable_block_size(page);  // note: not `mi_page_block_size` to account for padding
    /*if (bsize <= MI_LARGE_OBJ_SIZE_MAX) {
      mi_heap_stat_increase(heap, malloc_large, bsize);
      mi_heap_stat_counter_increase(heap, malloc_large_count, 1);
    }
    else */
    {
      _mi_stat_increase(&heap->tld->stats.malloc_huge, bsize);
      _mi_stat_counter_increase(&heap->tld->stats.malloc_huge_count, 1);
    }
  }
  return page;
}